

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O1

shared_ptr<int> __thiscall
nonsugar::
value_read<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_void>
::operator()(value_read<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_void>
             *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s)

{
  int iVar1;
  undefined8 *puVar2;
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<int> sVar3;
  int t;
  sstream_t ss;
  int local_19c;
  long local_198 [4];
  byte abStack_178 [96];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_198,in_RDX,_S_out|_S_in);
  std::istream::operator>>((istream *)local_198,&local_19c);
  if ((abStack_178[*(long *)(local_198[0] + -0x18)] & 5) == 0) {
    iVar1 = std::istream::peek();
    if (iVar1 == -1) {
      *(undefined8 *)this = 0;
      puVar2 = (undefined8 *)operator_new(0x18);
      puVar2[1] = 0x100000001;
      *puVar2 = &PTR___Sp_counted_ptr_inplace_001697c8;
      *(int *)(puVar2 + 2) = local_19c;
      *(undefined8 **)(this + 8) = puVar2;
      *(undefined8 **)this = puVar2 + 2;
      goto LAB_00135ffe;
    }
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
LAB_00135ffe:
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  std::ios_base::~ios_base(local_118);
  sVar3.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar3.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<int>)sVar3.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> operator()(String const &s) const
    {
        using sstream_t = detail::sstream<String>;
        sstream_t ss(s);
        T t;
        ss >> t;
        return ss && ss.peek() == sstream_t::traits_type::eof() ?
            detail::copy_shared(t) : nullptr;
    }